

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-strip.cc
# Opt level: O1

Result __thiscall
BinaryReaderStrip::BeginCustomSection
          (BinaryReaderStrip *this,Index section_index,Offset size,string_view section_name)

{
  MemoryStream *this_00;
  const_iterator cVar1;
  undefined1 local_29;
  key_type local_28;
  
  local_28._M_str = section_name._M_str;
  local_28._M_len = section_name._M_len;
  cVar1 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::find(&(this->sections_to_remove_)._M_t,&local_28);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->sections_to_remove_)._M_t._M_impl.super__Rb_tree_header) {
    cVar1 = std::
            _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::find(&(this->sections_to_keep_)._M_t,&local_28);
    if (((_Rb_tree_header *)cVar1._M_node !=
         &(this->sections_to_keep_)._M_t._M_impl.super__Rb_tree_header) ||
       ((this->sections_to_remove_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      this_00 = &this->stream_;
      local_29 = 0;
      wabt::Stream::WriteData(&this_00->super_Stream,&local_29,1,"section code",No);
      wabt::WriteU32Leb128(&this_00->super_Stream,(uint32_t)size,"section size");
      wabt::Stream::WriteData
                (&this_00->super_Stream,
                 ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->data +
                 this->section_start_,size,"section data",No);
    }
  }
  return (Result)Ok;
}

Assistant:

Result BeginCustomSection(Index section_index,
                            Offset size,
                            std::string_view section_name) override {
    if (sections_to_remove_.count(section_name) > 0) {
      return Result::Ok;
    }

    if (sections_to_keep_.count(section_name) > 0 ||
        !sections_to_remove_.empty()) {
      stream_.WriteU8Enum(BinarySection::Custom, "section code");
      WriteU32Leb128(&stream_, size, "section size");
      stream_.WriteData(state->data + section_start_, size, "section data");
    }
    return Result::Ok;
  }